

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O2

void __thiscall
llvm::
StringMap<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>,_llvm::MallocAllocator>
::clear(StringMap<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>,_llvm::MallocAllocator>
        *this)

{
  uint uVar1;
  StringMapEntryBase **ppSVar2;
  StringMapEntry<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>
  *this_00;
  ulong uVar3;
  
  if ((this->super_StringMapImpl).NumItems != 0) {
    uVar1 = (this->super_StringMapImpl).NumBuckets;
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      ppSVar2 = (this->super_StringMapImpl).TheTable;
      this_00 = (StringMapEntry<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>
                 *)ppSVar2[uVar3];
      if ((this_00 !=
           (StringMapEntry<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>
            *)0xfffffffffffffff8) &&
         (this_00 !=
          (StringMapEntry<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>
           *)0x0)) {
        StringMapEntry<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>
        ::Destroy<llvm::MallocAllocator>(this_00,(MallocAllocator *)&this->field_0x18);
      }
      ppSVar2[uVar3] = (StringMapEntryBase *)0x0;
    }
    (this->super_StringMapImpl).NumItems = 0;
    (this->super_StringMapImpl).NumTombstones = 0;
  }
  return;
}

Assistant:

bool empty() const { return NumItems == 0; }